

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O3

void def_check(int *shielding,bool *defend,int *damage)

{
  long *plVar1;
  ostream *poVar2;
  int iVar3;
  
  if (*shielding == 0) {
    if (*defend == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_4ec48,0x13);
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,(int)((double)*damage * 0.6));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_4eca0 + 0x14,10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      plVar1 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      *damage = (int)((double)*damage * 0.4);
      *defend = false;
    }
  }
  else if (0 < *shielding) {
    if (*defend == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_4ec74,0x11);
      iVar3 = *damage;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_4eca0,0x1e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      plVar1 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      *defend = false;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_4ec74,0x11);
      iVar3 = *damage;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_4ec8a,0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    *damage = 0;
  }
  return;
}

Assistant:

void def_check(int* shielding,bool* defend,int* damage){
    if(*shielding==0&&*defend==true)
    {
        cout<<"勇者防禦住了 "<<int(*damage*0.6)<<" 點傷害"<<endl<<endl;
        *damage=*damage*0.4;
        *defend=false;
    }
    else if(*shielding>0&&*defend==false)
    {
        cout<<"(護盾吸收了 "<<*damage<<" 點傷害)"<<endl;
        *damage=0;
    }
    else if(*shielding>0&&*defend==true)
    {
        cout<<"勇者防禦住了 0 點傷害"<<endl<<endl;
        *defend=false;
        cout<<"(護盾吸收了 "<<*damage<<" 點傷害)"<<endl;
        *damage=0;
    }
}